

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O3

ByteData * cfd::core::CryptoUtil::DecodeBase58Check(ByteData *__return_storage_ptr__,string *str)

{
  uchar *bytes_out;
  CfdException *this;
  value_type_conflict *__val;
  int ret;
  size_t written;
  int local_6c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  size_t local_50;
  string local_48;
  
  bytes_out = (uchar *)operator_new(0x400);
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = bytes_out;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = bytes_out + 0x400;
  memset(bytes_out,0,0x400);
  local_50 = 0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = bytes_out + 0x400;
  local_6c = wally_base58_to_bytes((str->_M_dataplus)._M_p,1,bytes_out,0x400,&local_50);
  if (local_6c == 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,local_50);
    ByteData::ByteData(__return_storage_ptr__,&local_68);
    if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  local_48._M_dataplus._M_p = "cfdcore_util.cpp";
  local_48._M_string_length._0_4_ = 0x3f2;
  local_48.field_2._M_allocated_capacity = (long)"CfdEncodeDecodeBase58Check" + 9;
  logger::log<int&>((CfdSourceLocation *)&local_48,kCfdLogLevelWarning,
                    "wally_base58_to_bytes NG[{}].",&local_6c);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Decode base58 error.","");
  CfdException::CfdException(this,kCfdIllegalStateError,&local_48);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData CryptoUtil::DecodeBase58Check(const std::string &str) {
  std::vector<uint8_t> output(1024);
  size_t written = 0;

  int ret = wally_base58_to_bytes(
      str.data(), BASE58_FLAG_CHECKSUM, output.data(), output.size(),
      &written);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_base58_to_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "Decode base58 error.");
  }

  output.resize(written);
  return ByteData(output);
}